

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer_tests.cpp
# Opt level: O0

void check_insert_or_assign(json *example,string *path,json *value,json *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_std::error_code_&> EVar1;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  error_code ec;
  undefined4 in_stack_fffffffffffffe58;
  Flags in_stack_fffffffffffffe5c;
  AssertionHandler *in_stack_fffffffffffffe60;
  AssertionHandler *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  ExprLhs<const_std::error_code_&> *in_stack_fffffffffffffe88;
  AssertionHandler *in_stack_fffffffffffffe90;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffe98;
  AssertionHandler local_130;
  error_code *local_b0;
  AssertionHandler local_98 [2];
  
  std::error_code::error_code((error_code *)in_stack_fffffffffffffe60);
  jsoncons::jsonpointer::
  add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffe60,
             (error_code *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_98[0].m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffe60,
                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  this_00 = local_98;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
             ,0x37);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffe68);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression.m_size = in_stack_fffffffffffffe80;
  capturedExpression.m_start = in_stack_fffffffffffffe78;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)in_stack_fffffffffffffe68,
             (SourceLineInfo *)in_stack_fffffffffffffe60,capturedExpression,
             in_stack_fffffffffffffe5c);
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (error_code *)0x71500d);
  local_b0 = EVar1.m_lhs;
  Catch::AssertionHandler::handleExpr<std::error_code_const&>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe60);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe60);
  local_130.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)in_stack_fffffffffffffe60,
                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  this = &local_130;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
             ,0x38);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)in_stack_fffffffffffffe68);
  capturedExpression_00.m_size = in_stack_fffffffffffffe80;
  capturedExpression_00.m_start = (char *)EVar1.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)in_stack_fffffffffffffe68,(SourceLineInfo *)this,
             capturedExpression_00,in_stack_fffffffffffffe5c);
  Catch::Decomposer::operator<=
            ((Decomposer *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x71511a);
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(in_stack_fffffffffffffe98,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffe90);
  Catch::AssertionHandler::handleExpr
            (this,(ITransientExpression *)
                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x715162);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  return;
}

Assistant:

void check_insert_or_assign(json& example, const std::string& path, const json& value, const json& expected)
{
    std::error_code ec;
    jsonpointer::add(example, path, value, ec);
    CHECK_FALSE(ec);
    CHECK(expected == example);
}